

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::FeatureType::clear_Type(FeatureType *this)

{
  switch(this->_oneof_case_[0]) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void FeatureType::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.FeatureType)
  switch (Type_case()) {
    case kInt64Type: {
      delete Type_.int64type_;
      break;
    }
    case kDoubleType: {
      delete Type_.doubletype_;
      break;
    }
    case kStringType: {
      delete Type_.stringtype_;
      break;
    }
    case kImageType: {
      delete Type_.imagetype_;
      break;
    }
    case kMultiArrayType: {
      delete Type_.multiarraytype_;
      break;
    }
    case kDictionaryType: {
      delete Type_.dictionarytype_;
      break;
    }
    case kSequenceType: {
      delete Type_.sequencetype_;
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}